

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

int Abc_TtCofactorPerm(word *pTruth,int i,int nWords,int fSwapOnly,char *pCanonPerm,
                      uint *puCanonPhase,int fNaive)

{
  long lVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  long lVar6;
  uint uVar7;
  
  bVar5 = (byte)i;
  if (fSwapOnly == 0) {
    Abc_TtCopy(Abc_TtCofactorPerm::pCopy1,pTruth,nWords,0);
    uVar3 = Abc_TtCofactorPermConfig(pTruth,i,nWords,0,fNaive);
    uVar7 = 0;
    if (uVar3 != 0) {
      iVar4 = Abc_TtCompareRev(pTruth,Abc_TtCofactorPerm::pCopy1,nWords);
      if (iVar4 == 1) {
        Abc_TtCopy(pTruth,Abc_TtCofactorPerm::pCopy1,nWords,0);
        uVar7 = 0;
      }
      else {
        if ((uVar3 & 1) != 0) {
          *puCanonPhase = *puCanonPhase ^ 1 << (bVar5 & 0x1f);
        }
        if ((uVar3 & 2) != 0) {
          *puCanonPhase = *puCanonPhase ^ 1 << (bVar5 + 1 & 0x1f);
        }
        uVar7 = uVar3;
        if ((uVar3 & 4) != 0) {
          uVar3 = *puCanonPhase;
          lVar6 = (long)i;
          lVar1 = lVar6 + 1;
          if (((uVar3 >> ((byte)lVar1 & 0x1f) ^ uVar3 >> (bVar5 & 0x1f)) & 1) != 0) {
            *puCanonPhase = uVar3 ^ 3 << (bVar5 & 0x1f);
          }
          cVar2 = pCanonPerm[lVar6];
          pCanonPerm[lVar6] = pCanonPerm[lVar1];
          pCanonPerm[lVar1] = cVar2;
        }
      }
    }
  }
  else {
    uVar3 = Abc_TtCofactorPermConfig(pTruth,i,nWords,1,0);
    uVar7 = 0;
    if (uVar3 != 0) {
      uVar7 = *puCanonPhase;
      lVar6 = (long)i;
      lVar1 = lVar6 + 1;
      if (((uVar7 >> ((byte)lVar1 & 0x1f) ^ uVar7 >> (bVar5 & 0x1f)) & 1) != 0) {
        *puCanonPhase = uVar7 ^ 3 << (bVar5 & 0x1f);
      }
      cVar2 = pCanonPerm[lVar6];
      pCanonPerm[lVar6] = pCanonPerm[lVar1];
      pCanonPerm[lVar1] = cVar2;
      uVar7 = uVar3;
    }
  }
  return uVar7;
}

Assistant:

int Abc_TtCofactorPerm( word * pTruth, int i, int nWords, int fSwapOnly, char * pCanonPerm, unsigned * puCanonPhase, int fNaive )
{
    if ( fSwapOnly )
    {
        int Config = Abc_TtCofactorPermConfig( pTruth, i, nWords, 1, 0 );
        if ( Config )
        {
            if ( ((*puCanonPhase >> i) & 1) != ((*puCanonPhase >> (i+1)) & 1) )
            {
                *puCanonPhase ^= (1 << i);
                *puCanonPhase ^= (1 << (i+1));
            }
            ABC_SWAP( int, pCanonPerm[i], pCanonPerm[i+1] );
        }
        return Config;
    }
    {
        static word pCopy1[1024];
        int Config;
        Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
        Config = Abc_TtCofactorPermConfig( pTruth, i, nWords, 0, fNaive );
        if ( Config == 0 )
            return 0;
        if ( Abc_TtCompareRev(pTruth, pCopy1, nWords) == 1 ) // made it worse
        {
            Abc_TtCopy( pTruth, pCopy1, nWords, 0 );
            return 0;
        }
        // improved
        if ( Config & 1 )
            *puCanonPhase ^= (1 << i);
        if ( Config & 2 )
            *puCanonPhase ^= (1 << (i+1));
        if ( Config & 4 )
        {
            if ( ((*puCanonPhase >> i) & 1) != ((*puCanonPhase >> (i+1)) & 1) )
            {
                *puCanonPhase ^= (1 << i);
                *puCanonPhase ^= (1 << (i+1));
            }
            ABC_SWAP( int, pCanonPerm[i], pCanonPerm[i+1] );
        }
        return Config;
    }
}